

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

void nifti_mat44_to_orientation(mat44 R,int *icod,int *jcod,int *kcod)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  mat33 C;
  float local_170;
  float local_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  float local_148;
  undefined1 local_138 [16];
  float local_120 [6];
  float local_108 [8];
  float local_e8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  float local_88;
  mat33 P;
  float local_44;
  float local_34;
  
  if (kcod != (int *)0x0 && (jcod != (int *)0x0 && icod != (int *)0x0)) {
    *kcod = 0;
    *jcod = 0;
    *icod = 0;
    fVar26 = SQRT(R.m[2][0] * R.m[2][0] + R.m[0][0] * R.m[0][0] + R.m[1][0] * R.m[1][0]);
    if ((fVar26 != 0.0) || (NAN(fVar26))) {
      fVar22 = SQRT(R.m[2][1] * R.m[2][1] + R.m[0][1] * R.m[0][1] + R.m[1][1] * R.m[1][1]);
      if ((fVar22 != 0.0) || (NAN(fVar22))) {
        auVar23._4_4_ = R.m[1][0];
        auVar23._0_4_ = R.m[0][0];
        auVar23._8_8_ = 0;
        auVar24._4_4_ = fVar26;
        auVar24._0_4_ = fVar26;
        auVar24._8_4_ = fVar26;
        auVar24._12_4_ = fVar26;
        auVar24 = divps(auVar23,auVar24);
        auVar27._4_4_ = R.m[2][0];
        auVar27._0_4_ = R.m[1][0];
        auVar27._8_8_ = 0;
        auVar28._4_4_ = fVar26;
        auVar28._0_4_ = fVar26;
        auVar28._8_4_ = fVar26;
        auVar28._12_4_ = fVar26;
        auVar28 = divps(auVar27,auVar28);
        local_120[1] = R.m[0][1] / fVar22;
        auVar29._4_4_ = R.m[2][1];
        auVar29._0_4_ = R.m[1][1];
        auVar29._8_8_ = 0;
        auVar30._4_4_ = fVar22;
        auVar30._0_4_ = fVar22;
        auVar30._8_4_ = fVar22;
        auVar30._12_4_ = fVar22;
        auVar30 = divps(auVar29,auVar30);
        local_120[0] = auVar24._0_4_;
        local_120[3] = auVar24._4_4_;
        local_108[0] = auVar28._4_4_;
        fVar26 = auVar30._4_4_ * local_108[0] +
                 local_120[0] * local_120[1] + local_120[3] * auVar30._0_4_;
        if (0.0001 < ABS(fVar26)) {
          local_120[1] = local_120[1] - fVar26 * local_120[0];
          auVar31._0_4_ = auVar30._0_4_ - fVar26 * auVar28._0_4_;
          auVar31._4_4_ = auVar30._4_4_ - fVar26 * local_108[0];
          auVar31._8_4_ = auVar30._8_4_ - fVar26 * auVar28._8_4_;
          auVar31._12_4_ = auVar30._12_4_ - fVar26 * auVar28._12_4_;
          fVar26 = SQRT(auVar31._4_4_ * auVar31._4_4_ +
                        local_120[1] * local_120[1] + auVar31._0_4_ * auVar31._0_4_);
          if ((fVar26 == 0.0) && (!NAN(fVar26))) {
            return;
          }
          local_120[1] = local_120[1] / fVar26;
          auVar3._4_4_ = fVar26;
          auVar3._0_4_ = fVar26;
          auVar3._8_4_ = fVar26;
          auVar3._12_4_ = fVar26;
          auVar30 = divps(auVar31,auVar3);
        }
        fVar26 = SQRT(R.m[2][2] * R.m[2][2] + R.m[0][2] * R.m[0][2] + R.m[1][2] * R.m[1][2]);
        local_120[4] = auVar30._0_4_;
        local_108[1] = auVar30._4_4_;
        if ((fVar26 != 0.0) || (NAN(fVar26))) {
          local_170 = R.m[1][2] / fVar26;
          auVar25._4_4_ = R.m[0][2];
          auVar25._0_4_ = R.m[2][2];
          auVar25._8_8_ = 0;
          auVar4._4_4_ = fVar26;
          auVar4._0_4_ = fVar26;
          auVar4._8_4_ = fVar26;
          auVar4._12_4_ = fVar26;
          local_138 = divps(auVar25,auVar4);
        }
        else {
          local_170 = local_108[0] * local_120[1] - local_120[0] * local_108[1];
          local_138._0_4_ = local_120[0] * local_120[4] - local_120[1] * auVar28._0_4_;
          local_138._4_4_ = local_120[3] * local_108[1] - local_120[4] * local_108[0];
          local_138._8_4_ = auVar24._8_4_ * auVar30._8_4_ - local_120[4] * auVar28._8_4_;
          local_138._12_4_ = auVar24._12_4_ * auVar30._12_4_ - local_120[4] * auVar28._12_4_;
        }
        local_e8 = local_138._4_4_;
        fVar26 = local_138._0_4_ * local_108[0] + local_e8 * local_120[0] + local_120[3] * local_170
        ;
        if (0.0001 < ABS(fVar26)) {
          local_e8 = local_e8 - fVar26 * local_120[0];
          local_170 = local_170 - fVar26 * local_120[3];
          fVar22 = local_138._0_4_ - fVar26 * local_108[0];
          fVar26 = SQRT(fVar22 * fVar22 + local_e8 * local_e8 + local_170 * local_170);
          if ((fVar26 == 0.0) && (!NAN(fVar26))) {
            return;
          }
          local_e8 = local_e8 / fVar26;
          local_170 = local_170 / fVar26;
          local_138._0_4_ = fVar22 / fVar26;
        }
        fVar26 = local_108[1] * local_138._0_4_ + local_120[1] * local_e8 + local_120[4] * local_170
        ;
        if (0.0001 < ABS(fVar26)) {
          local_e8 = local_e8 - fVar26 * local_120[1];
          local_170 = local_170 - fVar26 * local_120[4];
          fVar22 = local_138._0_4_ - fVar26 * local_108[1];
          fVar26 = SQRT(fVar22 * fVar22 + local_e8 * local_e8 + local_170 * local_170);
          if ((fVar26 == 0.0) && (!NAN(fVar26))) {
            return;
          }
          local_e8 = local_e8 / fVar26;
          local_170 = local_170 / fVar26;
          local_138._4_4_ = 0;
          local_138._0_4_ = fVar22 / fVar26;
        }
        fVar26 = (local_120[1] * local_108[0] * local_170 +
                 local_120[3] * local_108[1] * local_e8 +
                 ((local_120[0] * local_120[4] * (float)local_138._0_4_ -
                  local_120[0] * local_108[1] * local_170) -
                 local_120[3] * local_120[1] * (float)local_138._0_4_)) -
                 local_108[0] * local_120[4] * local_e8;
        if ((fVar26 != 0.0) || (NAN(fVar26))) {
          iVar16 = 0;
          uVar12 = 2;
          local_16c = 4.2039e-45;
          iVar6 = 1;
          fVar22 = -666.0;
          uVar15 = 1;
          iVar13 = 1;
          iVar7 = 1;
          uVar9 = 1;
          do {
            uVar18 = 1;
            do {
              if (uVar15 != uVar18) {
                uVar19 = 1;
                do {
                  if (uVar18 != uVar19 && uVar15 != uVar19) {
                    local_158 = 0;
                    uStack_150 = 0;
                    local_168 = 0;
                    uStack_160 = 0;
                    local_148 = 0.0;
                    iVar16 = -1;
                    do {
                      iVar17 = -1;
                      do {
                        iVar5 = -1;
                        do {
                          (&local_16c)[uVar15] = (float)iVar16;
                          *(float *)((long)&uStack_160 + uVar18 * 4) = (float)iVar17;
                          *(float *)((long)&local_158 + uVar19 * 4 + 4) = (float)iVar5;
                          if (0.0 < ((local_168._4_4_ * (float)uStack_150 * local_158._4_4_ +
                                     uStack_160._4_4_ * uStack_150._4_4_ * (float)uStack_160 +
                                     (((float)local_168 * (float)local_158 * local_148 -
                                      (float)local_168 * uStack_150._4_4_ * local_158._4_4_) -
                                     local_168._4_4_ * uStack_160._4_4_ * local_148)) -
                                    (float)local_158 * (float)uStack_150 * (float)uStack_160) *
                                    fVar26) {
                            local_120[2] = local_e8;
                            local_120[5] = local_170;
                            local_108[2] = (float)local_138._0_4_;
                            local_a8 = local_168;
                            uStack_a0 = uStack_160;
                            local_98 = local_158;
                            uStack_90 = uStack_150;
                            local_88 = local_148;
                            lVar10 = 0;
                            pfVar8 = P.m[2] + 1;
                            do {
                              fVar21 = *(float *)((long)&local_a8 + lVar10 * 0xc);
                              fVar1 = *(float *)((long)&local_a8 + lVar10 * 0xc + 4);
                              fVar2 = *(float *)((long)&uStack_a0 + lVar10 * 0xc);
                              lVar11 = 0;
                              do {
                                pfVar8[lVar11] =
                                     local_120[lVar11 + 6] * fVar2 +
                                     local_120[lVar11] * fVar21 + local_120[lVar11 + 3] * fVar1;
                                lVar11 = lVar11 + 1;
                              } while (lVar11 != 3);
                              lVar10 = lVar10 + 1;
                              pfVar8 = pfVar8 + 3;
                            } while (lVar10 != 3);
                            fVar21 = P.m[2][1] + local_44 + local_34;
                            if (fVar22 < fVar21) {
                              uVar9 = uVar15 & 0xffffffff;
                              uVar12 = uVar18 & 0xffffffff;
                              local_16c = (float)uVar19;
                              fVar22 = fVar21;
                              iVar7 = iVar16;
                              iVar13 = iVar17;
                              iVar6 = iVar5;
                            }
                          }
                          bVar20 = iVar5 < 0;
                          iVar5 = iVar5 + 2;
                        } while (bVar20);
                        bVar20 = iVar17 < 0;
                        iVar17 = iVar17 + 2;
                      } while (bVar20);
                      bVar20 = iVar16 < 0;
                      iVar16 = iVar16 + 2;
                    } while (bVar20);
                  }
                  uVar19 = uVar19 + 1;
                } while (uVar19 != 4);
                iVar16 = 4;
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 != 4);
            uVar15 = uVar15 + 1;
          } while (uVar15 != 4);
          uVar14 = iVar7 * (int)uVar9 + 3;
          iVar17 = 4;
          iVar7 = 4;
          if (uVar14 < 7) {
            iVar7 = *(int *)(&DAT_001172bc + (ulong)uVar14 * 4);
          }
          uVar14 = iVar13 * (int)uVar12 + 3;
          if (uVar14 < 7) {
            iVar17 = *(int *)(&DAT_001172bc + (ulong)uVar14 * 4);
          }
          uVar14 = iVar6 * (int)local_16c + 3;
          if ((uVar14 < 7) && ((0x77U >> (uVar14 & 0x1f) & 1) != 0)) {
            iVar16 = *(int *)(&DAT_001172d8 + (ulong)uVar14 * 4);
          }
          *icod = iVar7;
          *jcod = iVar17;
          *kcod = iVar16;
        }
      }
    }
  }
  return;
}

Assistant:

void nifti_mat44_to_orientation( mat44 R , int *icod, int *jcod, int *kcod )
{
   float xi,xj,xk , yi,yj,yk , zi,zj,zk , val,detQ,detP ;
   mat33 P , Q , M ;
   int i,j,k=0,p,q,r , ibest,jbest,kbest,pbest,qbest,rbest ;
   float vbest ;

   if( icod == NULL || jcod == NULL || kcod == NULL ) return ; /* bad */

   *icod = *jcod = *kcod = 0 ; /* error returns, if sh*t happens */

   /* load column vectors for each (i,j,k) direction from matrix */

   /*-- i axis --*/ /*-- j axis --*/ /*-- k axis --*/

   xi = R.m[0][0] ; xj = R.m[0][1] ; xk = R.m[0][2] ;
   yi = R.m[1][0] ; yj = R.m[1][1] ; yk = R.m[1][2] ;
   zi = R.m[2][0] ; zj = R.m[2][1] ; zk = R.m[2][2] ;

   /* normalize column vectors to get unit vectors along each ijk-axis */

   /* normalize i axis */

   val = (float)sqrt( xi*xi + yi*yi + zi*zi ) ;
   if( val == 0.0 ) return ;                 /* stupid input */
   xi /= val ; yi /= val ; zi /= val ;

   /* normalize j axis */

   val = (float)sqrt( xj*xj + yj*yj + zj*zj ) ;
   if( val == 0.0 ) return ;                 /* stupid input */
   xj /= val ; yj /= val ; zj /= val ;

   /* orthogonalize j axis to i axis, if needed */

   val = xi*xj + yi*yj + zi*zj ;    /* dot product between i and j */
   if( fabs(val) > 1.e-4 ){
     xj -= val*xi ; yj -= val*yi ; zj -= val*zi ;
     val = (float)sqrt( xj*xj + yj*yj + zj*zj ) ;  /* must renormalize */
     if( val == 0.0 ) return ;              /* j was parallel to i? */
     xj /= val ; yj /= val ; zj /= val ;
   }

   /* normalize k axis; if it is zero, make it the cross product i x j */

   val = (float)sqrt( xk*xk + yk*yk + zk*zk ) ;
   if( val == 0.0 ){ xk = yi*zj-zi*yj; yk = zi*xj-zj*xi ; zk=xi*yj-yi*xj ; }
   else            { xk /= val ; yk /= val ; zk /= val ; }

   /* orthogonalize k to i */

   val = xi*xk + yi*yk + zi*zk ;    /* dot product between i and k */
   if( fabs(val) > 1.e-4 ){
     xk -= val*xi ; yk -= val*yi ; zk -= val*zi ;
     val = (float)sqrt( xk*xk + yk*yk + zk*zk ) ;
     if( val == 0.0 ) return ;      /* bad */
     xk /= val ; yk /= val ; zk /= val ;
   }

   /* orthogonalize k to j */

   val = xj*xk + yj*yk + zj*zk ;    /* dot product between j and k */
   if( fabs(val) > 1.e-4 ){
     xk -= val*xj ; yk -= val*yj ; zk -= val*zj ;
     val = (float)sqrt( xk*xk + yk*yk + zk*zk ) ;
     if( val == 0.0 ) return ;      /* bad */
     xk /= val ; yk /= val ; zk /= val ;
   }

   Q.m[0][0] = xi ; Q.m[0][1] = xj ; Q.m[0][2] = xk ;
   Q.m[1][0] = yi ; Q.m[1][1] = yj ; Q.m[1][2] = yk ;
   Q.m[2][0] = zi ; Q.m[2][1] = zj ; Q.m[2][2] = zk ;

   /* at this point, Q is the rotation matrix from the (i,j,k) to (x,y,z) axes */

   detQ = nifti_mat33_determ( Q ) ;
   if( detQ == 0.0 ) return ; /* shouldn't happen unless user is a DUFIS */

   /* Build and test all possible +1/-1 coordinate permutation matrices P;
      then find the P such that the rotation matrix M=PQ is closest to the
      identity, in the sense of M having the smallest total rotation angle. */

   /* Despite the formidable looking 6 nested loops, there are
      only 3*3*3*2*2*2 = 216 passes, which will run very quickly. */

   vbest = -666.0f ; ibest=pbest=qbest=rbest=1 ; jbest=2 ; kbest=3 ;
   for( i=1 ; i <= 3 ; i++ ){     /* i = column number to use for row #1 */
    for( j=1 ; j <= 3 ; j++ ){    /* j = column number to use for row #2 */
     if( i == j ) continue ;
      for( k=1 ; k <= 3 ; k++ ){  /* k = column number to use for row #3 */
       if( i == k || j == k ) continue ;
       P.m[0][0] = P.m[0][1] = P.m[0][2] =
        P.m[1][0] = P.m[1][1] = P.m[1][2] =
         P.m[2][0] = P.m[2][1] = P.m[2][2] = 0.0f ;
       for( p=-1 ; p <= 1 ; p+=2 ){    /* p,q,r are -1 or +1      */
        for( q=-1 ; q <= 1 ; q+=2 ){   /* and go into rows #1,2,3 */
         for( r=-1 ; r <= 1 ; r+=2 ){
           P.m[0][i-1] = p ; P.m[1][j-1] = q ; P.m[2][k-1] = r ;
           detP = nifti_mat33_determ(P) ;           /* sign of permutation */
           if( detP * detQ <= 0.0 ) continue ;  /* doesn't match sign of Q */
           M = nifti_mat33_mul(P,Q) ;

           /* angle of M rotation = 2.0*acos(0.5*sqrt(1.0+trace(M)))       */
           /* we want largest trace(M) == smallest angle == M nearest to I */

           val = M.m[0][0] + M.m[1][1] + M.m[2][2] ; /* trace */
           if( val > vbest ){
             vbest = val ;
             ibest = i ; jbest = j ; kbest = k ;
             pbest = p ; qbest = q ; rbest = r ;
           }
   }}}}}}

   /* At this point ibest is 1 or 2 or 3; pbest is -1 or +1; etc.

      The matrix P that corresponds is the best permutation approximation
      to Q-inverse; that is, P (approximately) takes (x,y,z) coordinates
      to the (i,j,k) axes.

      For example, the first row of P (which contains pbest in column ibest)
      determines the way the i axis points relative to the anatomical
      (x,y,z) axes.  If ibest is 2, then the i axis is along the y axis,
      which is direction P2A (if pbest > 0) or A2P (if pbest < 0).

      So, using ibest and pbest, we can assign the output code for
      the i axis.  Mutatis mutandis for the j and k axes, of course. */

   switch( ibest*pbest ){
     case  1: i = NIFTI_L2R ; break ;
     case -1: i = NIFTI_R2L ; break ;
     case  2: i = NIFTI_P2A ; break ;
     case -2: i = NIFTI_A2P ; break ;
     case  3: i = NIFTI_I2S ; break ;
     case -3: i = NIFTI_S2I ; break ;
   }

   switch( jbest*qbest ){
     case  1: j = NIFTI_L2R ; break ;
     case -1: j = NIFTI_R2L ; break ;
     case  2: j = NIFTI_P2A ; break ;
     case -2: j = NIFTI_A2P ; break ;
     case  3: j = NIFTI_I2S ; break ;
     case -3: j = NIFTI_S2I ; break ;
   }

   switch( kbest*rbest ){
     case  1: k = NIFTI_L2R ; break ;
     case -1: k = NIFTI_R2L ; break ;
     case  2: k = NIFTI_P2A ; break ;
     case -2: k = NIFTI_A2P ; break ;
     case  3: k = NIFTI_I2S ; break ;
     case -3: k = NIFTI_S2I ; break ;
   }

   *icod = i ; *jcod = j ; *kcod = k ; return ;
}